

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.c
# Opt level: O1

void m68k_init(void)

{
  if (m68k_init_emulation_initialized == '\0') {
    m68ki_build_opcode_table();
    m68k_init_emulation_initialized = '\x01';
  }
  m68ki_cpu.int_ack_callback = default_int_ack_callback;
  m68ki_cpu.bkpt_ack_callback = default_bkpt_ack_callback;
  m68ki_cpu.reset_instr_callback = default_reset_instr_callback;
  m68ki_cpu.cmpild_instr_callback = default_cmpild_instr_callback;
  m68ki_cpu.rte_instr_callback = default_rte_instr_callback;
  m68ki_cpu.tas_instr_callback = default_tas_instr_callback;
  m68ki_cpu.illg_instr_callback = default_illg_instr_callback;
  m68ki_cpu.pc_changed_callback = default_pc_changed_callback;
  m68ki_cpu.set_fc_callback = default_set_fc_callback;
  m68ki_cpu.instr_hook_callback = default_instr_hook_callback;
  return;
}

Assistant:

void m68k_init(void)
{
	static uint emulation_initialized = 0;

	/* The first call to this function initializes the opcode handler jump table */
	if(!emulation_initialized)
		{
		m68ki_build_opcode_table();
		emulation_initialized = 1;
	}

	m68k_set_int_ack_callback(NULL);
	m68k_set_bkpt_ack_callback(NULL);
	m68k_set_reset_instr_callback(NULL);
	m68k_set_cmpild_instr_callback(NULL);
	m68k_set_rte_instr_callback(NULL);
	m68k_set_tas_instr_callback(NULL);
	m68k_set_illg_instr_callback(NULL);
	m68k_set_pc_changed_callback(NULL);
	m68k_set_fc_callback(NULL);
	m68k_set_instr_hook_callback(NULL);
}